

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  value_type *lhs;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  opt_type o2;
  other_opt_type o1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  storage_type local_52;
  storage_type local_51;
  AssertHelper local_50;
  storage_type local_48;
  undefined7 uStack_47;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  AssertHelper local_18;
  
  local_51.null_value = -1;
  local_52.null_value = '\a';
  local_38._M_dataplus._M_p._0_1_ = 1;
  local_38._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._M_dataplus._M_p._0_1_ = '\x01';
  local_38._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::value
              ((opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> *)
               &local_51.value);
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_48.value,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1d9,
             "Expected: o1.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_48.value,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48.value);
  if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  lhs = &(this->
         super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
         ).value_2;
  local_48 = (storage_type)
             (this->
             super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
             ).other_value_2;
  if (local_51.null_value != -1) {
    local_48 = local_51;
  }
  testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
            ((EqHelper<false> *)&local_38,"this->value_2","o1.value_or(this->other_value_2)",lhs,
             &local_48.null_value);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48.value);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1da,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48.value);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(uStack_47,local_48.null_value) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(uStack_47,local_48.null_value) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(uStack_47,local_48.null_value) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (storage_type)(local_52.null_value == '\a');
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48.null_value) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_48.value,(AssertionResult *)0x1b9f12,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1db,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (storage_type)(local_52.null_value == '\a');
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48.null_value) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_48.value,(AssertionResult *)"o2.has_value()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1dc,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
             *)&local_52.value);
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_48.value,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1dd,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_48.value,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48.value);
  if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  local_48.null_value = lhs->value_;
  if (local_52.null_value != '\a') {
    local_48 = local_52;
  }
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&local_38,"this->value_2","o2.value_or(this->value_2)",lhs,
             &local_48.value);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48.value);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48.value);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(uStack_47,local_48.null_value) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(uStack_47,local_48.null_value) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(uStack_47,local_48.null_value) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyConstructionForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2{o1};
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}